

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int PatchText(int oldSize)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined3 uVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined3 uVar15;
  int iVar16;
  int *string;
  int *piVar17;
  int iVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  uint uVar23;
  DehSpriteMap *__s1;
  ulong uVar24;
  DehSpriteMap *__s1_00;
  
  pcVar22 = Line2 + -2;
  do {
    pcVar21 = pcVar22 + 2;
    pcVar22 = pcVar22 + 1;
  } while (' ' < *pcVar21);
  do {
    cVar1 = pcVar22[1];
    pcVar22 = pcVar22 + 1;
    if (cVar1 == '\0') break;
  } while (cVar1 < '!');
  if (cVar1 == '\0') {
    Printf("Text chunk is missing size of new string.\n");
    return 2;
  }
  iVar16 = atoi(pcVar22);
  string = (int *)operator_new__((long)(oldSize + 1));
  pcVar22 = (char *)operator_new__((long)(iVar16 + 1));
  piVar17 = string;
  iVar18 = oldSize;
  if (oldSize != 0) {
    do {
      pcVar21 = PatchPt + 1;
      if (*PatchPt != '\r') {
        *(char *)piVar17 = *PatchPt;
        piVar17 = (int *)((long)piVar17 + 1);
        iVar18 = iVar18 + -1;
      }
      PatchPt = pcVar21;
    } while ((iVar18 != 0) && (*pcVar21 != '\0'));
  }
  *(char *)piVar17 = '\0';
  pcVar21 = pcVar22;
  if (iVar16 != 0) {
    do {
      pcVar19 = PatchPt + 1;
      if (*PatchPt != '\r') {
        *pcVar21 = *PatchPt;
        pcVar21 = pcVar21 + 1;
        iVar16 = iVar16 + -1;
      }
      PatchPt = pcVar19;
    } while ((iVar16 != 0) && (*pcVar19 != '\0'));
  }
  *pcVar21 = '\0';
  if (includenotext == '\x01') {
    Printf("Skipping text chunk in included patch.\n");
  }
  else {
    bVar5 = false;
    DPrintf(4,"Searching for text:\n%s\n",string);
    if (oldSize == 4) {
      iVar18 = -1;
      if (0 < (long)NumUnchangedSprites) {
        lVar20 = 0;
        do {
          if (*(int *)(UnchangedSpriteNames + lVar20 * 4) == *string) {
            iVar18 = (int)lVar20;
            break;
          }
          lVar20 = lVar20 + 1;
        } while (NumUnchangedSprites != lVar20);
      }
      if (iVar18 != -1) {
        strncpy((char *)(sprites.Array + iVar18),pcVar22,4);
        iVar18 = strncmp("PLAY",(char *)string,4);
        if (iVar18 == 0) {
          strncpy(deh.PlayerSprite,pcVar22,4);
        }
        if (OrgSprNames.Count != 0) {
          lVar20 = 0;
          uVar24 = 0;
          do {
            pcVar21 = (OrgSprNames.Array)->c;
            iVar18 = strcasecmp(pcVar21 + lVar20,(char *)string);
            if (iVar18 == 0) {
              strcpy(pcVar21 + lVar20,pcVar22);
            }
            uVar24 = uVar24 + 1;
            lVar20 = lVar20 + 5;
          } while (uVar24 < OrgSprNames.Count);
        }
        __s1_00 = DehSpriteMappings;
        uVar24 = 0;
        do {
          iVar18 = strncmp(__s1_00->Sprite,(char *)string,4);
          if (iVar18 == 0) {
            strncpy(__s1_00->Sprite,pcVar22,4);
            if (uVar24 == 0) goto LAB_00487275;
            lVar20 = uVar24 + 1;
            goto LAB_00487227;
          }
          uVar24 = uVar24 + 1;
          __s1_00 = __s1_00 + 1;
        } while (uVar24 != 0x24);
        goto LAB_004872cc;
      }
    }
    while (pcVar21 = FStringTable::MatchString(EnglishStrings,(char *)string),
          pcVar21 != (char *)0x0) {
      FStringTable::SetString(&GStrings,pcVar21,pcVar22);
      FStringTable::SetString(EnglishStrings,pcVar21,"~~");
      bVar5 = true;
    }
    if (!bVar5) {
      DPrintf(4,"   (Unmatched)\n");
    }
  }
  goto LAB_004872cc;
  while( true ) {
    cVar10 = __s1->Sprite[0];
    cVar11 = __s1->Sprite[1];
    cVar12 = __s1->Sprite[2];
    cVar13 = __s1->Sprite[3];
    cVar14 = __s1->Sprite[4];
    uVar15 = *(undefined3 *)&__s1->field_0x5;
    pcVar21 = DehSpriteMappings[uVar23].ClassName;
    cVar1 = __s1_00->Sprite[1];
    cVar6 = __s1_00->Sprite[2];
    cVar7 = __s1_00->Sprite[3];
    cVar8 = __s1_00->Sprite[4];
    uVar9 = *(undefined3 *)&__s1_00->field_0x5;
    pcVar19 = __s1_00->ClassName;
    __s1->Sprite[0] = __s1_00->Sprite[0];
    __s1->Sprite[1] = cVar1;
    __s1->Sprite[2] = cVar6;
    __s1->Sprite[3] = cVar7;
    __s1->Sprite[4] = cVar8;
    *(undefined3 *)&__s1->field_0x5 = uVar9;
    DehSpriteMappings[uVar23].ClassName = pcVar19;
    __s1_00->Sprite[0] = cVar10;
    __s1_00->Sprite[1] = cVar11;
    __s1_00->Sprite[2] = cVar12;
    __s1_00->Sprite[3] = cVar13;
    __s1_00->Sprite[4] = cVar14;
    *(undefined3 *)&__s1_00->field_0x5 = uVar15;
    __s1_00->ClassName = pcVar21;
    lVar20 = lVar20 + -1;
    __s1_00 = __s1_00 + -1;
    if (lVar20 < 2) break;
LAB_00487227:
    uVar23 = (int)lVar20 - 2;
    __s1 = DehSpriteMappings + uVar23;
    iVar18 = strncmp(__s1->Sprite,pcVar22,4);
    if (iVar18 < 1) {
      uVar24 = (ulong)((int)lVar20 - 1);
      goto LAB_00487275;
    }
  }
  uVar24 = 0;
LAB_00487275:
  if ((uint)uVar24 < 0x23) {
    lVar20 = (uVar24 & 0xffffffff) << 4;
    do {
      pcVar21 = DehSpriteMappings[1].Sprite + lVar20;
      iVar18 = strncmp(pcVar21,pcVar22,4);
      if (-1 < iVar18) break;
      uVar2 = *(undefined8 *)pcVar21;
      uVar3 = *(undefined8 *)(DehSpriteMappings[1].Sprite + lVar20 + 8);
      uVar4 = *(undefined8 *)(DehSpriteMappings[0].Sprite + lVar20 + 8);
      *(undefined8 *)pcVar21 = *(undefined8 *)(DehSpriteMappings[0].Sprite + lVar20);
      *(undefined8 *)(DehSpriteMappings[1].Sprite + lVar20 + 8) = uVar4;
      *(undefined8 *)(DehSpriteMappings[0].Sprite + lVar20) = uVar2;
      *(undefined8 *)(DehSpriteMappings[0].Sprite + lVar20 + 8) = uVar3;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x230);
  }
LAB_004872cc:
  operator_delete__(pcVar22);
  operator_delete__(string);
  do {
    iVar18 = GetLine();
  } while (iVar18 == 1);
  return iVar18;
}

Assistant:

static int PatchText (int oldSize)
{
	int newSize;
	char *oldStr;
	char *newStr;
	char *temp;
	INTBOOL good;
	int result;
	int i;

	// Skip old size, since we already know it
	temp = Line2;
	while (*temp > ' ')
		temp++;
	while (*temp && *temp <= ' ')
		temp++;

	if (*temp == 0)
	{
		Printf ("Text chunk is missing size of new string.\n");
		return 2;
	}
	newSize = atoi (temp);

	oldStr = new char[oldSize + 1];
	newStr = new char[newSize + 1];

	if (!oldStr || !newStr)
	{
		Printf ("Out of memory.\n");
		goto donewithtext;
	}

	good = ReadChars (&oldStr, oldSize);
	good += ReadChars (&newStr, newSize);

	if (!good)
	{
		delete[] newStr;
		delete[] oldStr;
		Printf ("Unexpected end-of-file.\n");
		return 0;
	}

	if (includenotext)
	{
		Printf ("Skipping text chunk in included patch.\n");
		goto donewithtext;
	}

	DPrintf (DMSG_SPAMMY, "Searching for text:\n%s\n", oldStr);
	good = false;

	// Search through sprite names; they are always 4 chars
	if (oldSize == 4)
	{
		i = FindSprite (oldStr);
		if (i != -1)
		{
			strncpy (sprites[i].name, newStr, 4);
			if (strncmp ("PLAY", oldStr, 4) == 0)
			{
				strncpy (deh.PlayerSprite, newStr, 4);
			}
			for (unsigned ii = 0; ii < OrgSprNames.Size(); ii++)
			{
				if (!stricmp(OrgSprNames[ii].c, oldStr))
				{
					strcpy(OrgSprNames[ii].c, newStr);
				}
			}
			// If this sprite is used by a pickup, then the DehackedPickup sprite map
			// needs to be updated too.
			for (i = 0; (size_t)i < countof(DehSpriteMappings); ++i)
			{
				if (strncmp (DehSpriteMappings[i].Sprite, oldStr, 4) == 0)
				{
					// Found a match, so change it.
					strncpy (DehSpriteMappings[i].Sprite, newStr, 4);

					// Now shift the map's entries around so that it stays sorted.
					// This must be done because the map is scanned using a binary search.
					while (i > 0 && strncmp (DehSpriteMappings[i-1].Sprite, newStr, 4) > 0)
					{
						swapvalues (DehSpriteMappings[i-1], DehSpriteMappings[i]);
						--i;
					}
					while ((size_t)i < countof(DehSpriteMappings)-1 &&
						strncmp (DehSpriteMappings[i+1].Sprite, newStr, 4) < 0)
					{
						swapvalues (DehSpriteMappings[i+1], DehSpriteMappings[i]);
						++i;
					}
					break;
				}
			}
			goto donewithtext;
		}
	}

	// Search through most other texts
	const char *str;
	do
	{
		str = EnglishStrings->MatchString(oldStr);
		if (str != NULL)
		{
			GStrings.SetString(str, newStr);
			EnglishStrings->SetString(str, "~~");	// set to something invalid so that it won't get found again by the next iteration or  by another replacement later
			good = true;
		}
	} 
	while (str != NULL);	// repeat search until the text can no longer be found

	if (!good)
	{
		DPrintf (DMSG_SPAMMY, "   (Unmatched)\n");
	}
		
donewithtext:
	if (newStr)
		delete[] newStr;
	if (oldStr)
		delete[] oldStr;

	// Fetch next identifier for main loop
	while ((result = GetLine ()) == 1)
		;

	return result;
}